

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O2

void Eigen::internal::evaluateProductBlockingSizesHeuristic<double,double,4,long>
               (long *k,long *m,long *n,long num_threads)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ptrdiff_t l3;
  ptrdiff_t l2;
  ptrdiff_t l1;
  
  manage_caching_sizes(GetAction,&l1,&l2,&l3);
  if (num_threads < 2) {
    uVar3 = *m;
    uVar2 = *n;
    if (*n < (long)uVar3) {
      uVar2 = uVar3;
    }
    uVar8 = *k;
    if ((long)uVar2 < (long)uVar8) {
      uVar2 = uVar8;
    }
    if ((long)uVar2 < 0x30) {
      return;
    }
    uVar5 = (l1 + -0x80) / 0x100 & 0xfffffffffffffff8;
    uVar2 = 1;
    if (1 < (long)uVar5) {
      uVar2 = uVar5;
    }
    uVar5 = uVar8;
    if ((long)uVar2 < (long)uVar8) {
      uVar5 = uVar2;
      if (uVar8 % uVar2 != 0) {
        uVar5 = uVar2 + ((long)(~(uVar8 % uVar2) + uVar2) / (long)((uVar8 / uVar2) * 8 + 8)) * -8;
      }
      *k = uVar5;
      uVar3 = *m;
    }
    uVar9 = l1 + -0x80 + uVar3 * uVar5 * -8;
    if ((long)uVar9 < (long)(uVar5 * 0x20)) {
      uVar2 = uVar2 << 5;
      uVar9 = 0x480000;
    }
    else {
      uVar2 = uVar5 * 8;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar5 << 4;
    uVar7 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x180000)) / auVar1,0);
    if ((long)(uVar9 / uVar2) < (long)uVar7) {
      uVar7 = uVar9 / uVar2;
    }
    uVar7 = uVar7 & 0xfffffffffffffffc;
    lVar6 = *n;
    if ((long)uVar7 < lVar6) {
      if (lVar6 % (long)uVar7 != 0) {
        uVar7 = uVar7 + ((long)(uVar7 - lVar6 % (long)uVar7) / ((lVar6 / (long)uVar7) * 4 + 4)) * -4
        ;
      }
      *n = uVar7;
      return;
    }
    if (uVar8 != uVar5) {
      return;
    }
    uVar5 = lVar6 * uVar8 * 8;
    uVar2 = uVar3;
    if ((((0x400 < (long)uVar5) && (l1 = 0x180000, uVar5 < 0x8001)) && (l3 != 0)) &&
       (l1 = l2, uVar2 = 0x240, (long)uVar3 < 0x240)) {
      uVar2 = uVar3;
    }
    uVar8 = (ulong)l1 / (uVar8 * 0x18);
    if ((long)uVar2 < (long)uVar8) {
      uVar8 = uVar2;
    }
    if ((long)uVar8 < 5) {
      if (uVar8 == 0) {
        return;
      }
    }
    else {
      uVar8 = uVar8 & 0x7ffffffffffffffc;
    }
    if ((long)uVar3 % (long)uVar8 != 0) {
      uVar8 = uVar8 + ((long)(uVar8 - (long)uVar3 % (long)uVar8) /
                      (((long)uVar3 / (long)uVar8) * 4 + 4)) * -4;
    }
  }
  else {
    uVar2 = (l1 + -0x80) / 0x100;
    uVar3 = 0x140;
    if ((long)uVar2 < 0x140) {
      uVar3 = uVar2;
    }
    uVar2 = 8;
    if (8 < (long)uVar3) {
      uVar2 = uVar3;
    }
    uVar3 = *k;
    if ((long)uVar2 < (long)uVar3) {
      uVar3 = uVar2 & 0x7ffffffffffffff8;
      *k = uVar3;
    }
    uVar3 = (ulong)(l2 - l1) / (uVar3 << 5);
    lVar6 = *n;
    lVar4 = (num_threads + lVar6 + -1) / num_threads;
    if (lVar4 < (long)uVar3) {
      lVar4 = lVar4 + 3;
      lVar4 = lVar4 - lVar4 % 4;
      if (lVar6 <= lVar4) {
        lVar4 = lVar6;
      }
    }
    else {
      lVar4 = uVar3 - (long)uVar3 % 4;
    }
    *n = lVar4;
    if (l3 - l2 == 0 || l3 < l2) {
      return;
    }
    uVar2 = (ulong)(l3 - l2) / (ulong)(*k * num_threads * 8);
    uVar3 = *m;
    lVar6 = (long)(num_threads + -1 + uVar3) / num_threads;
    if (3 < (long)uVar2 && (long)uVar2 < lVar6) {
      *m = uVar2 & 0x7ffffffffffffffc;
      return;
    }
    lVar6 = lVar6 + 3;
    uVar8 = lVar6 - lVar6 % 4;
    if ((long)uVar3 <= (long)uVar8) {
      uVar8 = uVar3;
    }
  }
  *m = uVar8;
  return;
}

Assistant:

void evaluateProductBlockingSizesHeuristic(Index& k, Index& m, Index& n, Index num_threads = 1)
{
  typedef gebp_traits<LhsScalar,RhsScalar> Traits;

  // Explanations:
  // Let's recall that the product algorithms form mc x kc vertical panels A' on the lhs and
  // kc x nc blocks B' on the rhs. B' has to fit into L2/L3 cache. Moreover, A' is processed
  // per mr x kc horizontal small panels where mr is the blocking size along the m dimension
  // at the register level. This small horizontal panel has to stay within L1 cache.
  std::ptrdiff_t l1, l2, l3;
  manage_caching_sizes(GetAction, &l1, &l2, &l3);
  #ifdef EIGEN_VECTORIZE_AVX512
  // We need to find a rationale for that, but without this adjustment,
  // performance with AVX512 is pretty bad, like -20% slower.
  // One reason is that with increasing packet-size, the blocking size k
  // has to become pretty small if we want that 1 lhs panel fit within L1.
  // For instance, with the 3pX4 kernel and double, the size of the lhs+rhs panels are:
  //   k*(3*64 + 4*8) Bytes, with l1=32kBytes, and k%8=0, we have k=144.
  // This is quite small for a good reuse of the accumulation registers.
  l1 *= 4;
  #endif

  if (num_threads > 1) {
    typedef typename Traits::ResScalar ResScalar;
    enum {
      kdiv = KcFactor * (Traits::mr * sizeof(LhsScalar) + Traits::nr * sizeof(RhsScalar)),
      ksub = Traits::mr * Traits::nr * sizeof(ResScalar),
      kr = 8,
      mr = Traits::mr,
      nr = Traits::nr
    };
    // Increasing k gives us more time to prefetch the content of the "C"
    // registers. However once the latency is hidden there is no point in
    // increasing the value of k, so we'll cap it at 320 (value determined
    // experimentally).
    // To avoid that k vanishes, we make k_cache at least as big as kr
    const Index k_cache = numext::maxi<Index>(kr, (numext::mini<Index>)((l1-ksub)/kdiv, 320));
    if (k_cache < k) {
      k = k_cache - (k_cache % kr);
      eigen_internal_assert(k > 0);
    }

    const Index n_cache = (l2-l1) / (nr * sizeof(RhsScalar) * k);
    const Index n_per_thread = numext::div_ceil(n, num_threads);
    if (n_cache <= n_per_thread) {
      // Don't exceed the capacity of the l2 cache.
      eigen_internal_assert(n_cache >= static_cast<Index>(nr));
      n = n_cache - (n_cache % nr);
      eigen_internal_assert(n > 0);
    } else {
      n = (numext::mini<Index>)(n, (n_per_thread + nr - 1) - ((n_per_thread + nr - 1) % nr));
    }

    if (l3 > l2) {
      // l3 is shared between all cores, so we'll give each thread its own chunk of l3.
      const Index m_cache = (l3-l2) / (sizeof(LhsScalar) * k * num_threads);
      const Index m_per_thread = numext::div_ceil(m, num_threads);
      if(m_cache < m_per_thread && m_cache >= static_cast<Index>(mr)) {
        m = m_cache - (m_cache % mr);
        eigen_internal_assert(m > 0);
      } else {
        m = (numext::mini<Index>)(m, (m_per_thread + mr - 1) - ((m_per_thread + mr - 1) % mr));
      }
    }
  }
  else {
    // In unit tests we do not want to use extra large matrices,
    // so we reduce the cache size to check the blocking strategy is not flawed
#ifdef EIGEN_DEBUG_SMALL_PRODUCT_BLOCKS
    l1 = 9*1024;
    l2 = 32*1024;
    l3 = 512*1024;
#endif

    // Early return for small problems because the computation below are time consuming for small problems.
    // Perhaps it would make more sense to consider k*n*m??
    // Note that for very tiny problem, this function should be bypassed anyway
    // because we use the coefficient-based implementation for them.
    if((numext::maxi)(k,(numext::maxi)(m,n))<48)
      return;

    typedef typename Traits::ResScalar ResScalar;
    enum {
      k_peeling = 8,
      k_div = KcFactor * (Traits::mr * sizeof(LhsScalar) + Traits::nr * sizeof(RhsScalar)),
      k_sub = Traits::mr * Traits::nr * sizeof(ResScalar)
    };

    // ---- 1st level of blocking on L1, yields kc ----

    // Blocking on the third dimension (i.e., k) is chosen so that an horizontal panel
    // of size mr x kc of the lhs plus a vertical panel of kc x nr of the rhs both fits within L1 cache.
    // We also include a register-level block of the result (mx x nr).
    // (In an ideal world only the lhs panel would stay in L1)
    // Moreover, kc has to be a multiple of 8 to be compatible with loop peeling, leading to a maximum blocking size of:
    const Index max_kc = numext::maxi<Index>(((l1-k_sub)/k_div) & (~(k_peeling-1)),1);
    const Index old_k = k;
    if(k>max_kc)
    {
      // We are really blocking on the third dimension:
      // -> reduce blocking size to make sure the last block is as large as possible
      //    while keeping the same number of sweeps over the result.
      k = (k%max_kc)==0 ? max_kc
                        : max_kc - k_peeling * ((max_kc-1-(k%max_kc))/(k_peeling*(k/max_kc+1)));

      eigen_internal_assert(((old_k/k) == (old_k/max_kc)) && "the number of sweeps has to remain the same");
    }

    // ---- 2nd level of blocking on max(L2,L3), yields nc ----

    // TODO find a reliable way to get the actual amount of cache per core to use for 2nd level blocking, that is:
    //      actual_l2 = max(l2, l3/nb_core_sharing_l3)
    // The number below is quite conservative: it is better to underestimate the cache size rather than overestimating it)
    // For instance, it corresponds to 6MB of L3 shared among 4 cores.
    #ifdef EIGEN_DEBUG_SMALL_PRODUCT_BLOCKS
    const Index actual_l2 = l3;
    #else
    const Index actual_l2 = 1572864; // == 1.5 MB
    #endif

    // Here, nc is chosen such that a block of kc x nc of the rhs fit within half of L2.
    // The second half is implicitly reserved to access the result and lhs coefficients.
    // When k<max_kc, then nc can arbitrarily growth. In practice, it seems to be fruitful
    // to limit this growth: we bound nc to growth by a factor x1.5.
    // However, if the entire lhs block fit within L1, then we are not going to block on the rows at all,
    // and it becomes fruitful to keep the packed rhs blocks in L1 if there is enough remaining space.
    Index max_nc;
    const Index lhs_bytes = m * k * sizeof(LhsScalar);
    const Index remaining_l1 = l1- k_sub - lhs_bytes;
    if(remaining_l1 >= Index(Traits::nr*sizeof(RhsScalar))*k)
    {
      // L1 blocking
      max_nc = remaining_l1 / (k*sizeof(RhsScalar));
    }
    else
    {
      // L2 blocking
      max_nc = (3*actual_l2)/(2*2*max_kc*sizeof(RhsScalar));
    }
    // WARNING Below, we assume that Traits::nr is a power of two.
    Index nc = numext::mini<Index>(actual_l2/(2*k*sizeof(RhsScalar)), max_nc) & (~(Traits::nr-1));
    if(n>nc)
    {
      // We are really blocking over the columns:
      // -> reduce blocking size to make sure the last block is as large as possible
      //    while keeping the same number of sweeps over the packed lhs.
      //    Here we allow one more sweep if this gives us a perfect match, thus the commented "-1"
      n = (n%nc)==0 ? nc
                    : (nc - Traits::nr * ((nc/*-1*/-(n%nc))/(Traits::nr*(n/nc+1))));
    }
    else if(old_k==k)
    {
      // So far, no blocking at all, i.e., kc==k, and nc==n.
      // In this case, let's perform a blocking over the rows such that the packed lhs data is kept in cache L1/L2
      // TODO: part of this blocking strategy is now implemented within the kernel itself, so the L1-based heuristic here should be obsolete.
      Index problem_size = k*n*sizeof(LhsScalar);
      Index actual_lm = actual_l2;
      Index max_mc = m;
      if(problem_size<=1024)
      {
        // problem is small enough to keep in L1
        // Let's choose m such that lhs's block fit in 1/3 of L1
        actual_lm = l1;
      }
      else if(l3!=0 && problem_size<=32768)
      {
        // we have both L2 and L3, and problem is small enough to be kept in L2
        // Let's choose m such that lhs's block fit in 1/3 of L2
        actual_lm = l2;
        max_mc = (numext::mini<Index>)(576,max_mc);
      }
      Index mc = (numext::mini<Index>)(actual_lm/(3*k*sizeof(LhsScalar)), max_mc);
      if (mc > Traits::mr) mc -= mc % Traits::mr;
      else if (mc==0) return;
      m = (m%mc)==0 ? mc
                    : (mc - Traits::mr * ((mc/*-1*/-(m%mc))/(Traits::mr*(m/mc+1))));
    }
  }
}